

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.cpp
# Opt level: O2

void * NMEADeviceThread(void *pParam)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  tm *ptVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_1160;
  double local_1158;
  double z_gps_mes;
  double local_1148;
  int local_113c;
  time_t tt;
  double x_gps_mes;
  tm local_1118;
  double local_10d8;
  double y_gps_mes;
  timeval local_10b8;
  interval local_10a0;
  CHRONO chrono_period;
  NMEADATA nmeadata;
  char szTemp [256];
  NMEADEVICE nmeadevice;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  
  tt = 0;
  iVar13 = (int)pParam;
  sprintf(szCfgFilePath,"NMEADevice%d.txt",(ulong)pParam & 0xffffffff);
  memset(&nmeadevice,0,0x930);
  GNSSqualityNMEADevice[iVar13] = 0;
  StartChrono(&chrono_period);
  iVar14 = 100;
  bVar4 = false;
  local_113c = 0;
  do {
    bVar4 = !bVar4;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)iVar14);
      if (bPauseNMEADevice[iVar13] == 0) break;
      if (!bVar4) {
        puts("NMEADevice paused.");
        GNSSqualityNMEADevice[iVar13] = 0;
        DisconnectNMEADevice(&nmeadevice);
      }
      if (bExit != 0) goto LAB_00145346;
      mSleep(100);
      bVar4 = true;
    }
    if (bRestartNMEADevice[iVar13] == 0) {
      if (bVar4) goto LAB_00144a40;
      iVar11 = GetLatestDataNMEADevice(&nmeadevice,&nmeadata);
      if (iVar11 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if (nmeadata.status == 'A' || 0 < nmeadata.GPS_quality_indicator) {
          x_gps_mes = 0.0;
          y_gps_mes = 0.0;
          z_gps_mes = 0.0;
          GNSSqualityNMEADevice[iVar13] = 1;
          GPS2EnvCoordSystem(lat_env,long_env,alt_env,angle_env,nmeadata.Latitude,nmeadata.Longitude
                             ,nmeadata.Altitude,&x_gps_mes,&y_gps_mes,&z_gps_mes);
          local_1160 = x_gps_mes - GPS_med_acc;
          local_1148 = x_gps_mes + GPS_med_acc;
          interval::interval(&local_10a0,&local_1160,&local_1148);
          interval::operator=((interval *)&x_gps,&local_10a0);
          local_1160 = y_gps_mes - GPS_med_acc;
          local_1148 = y_gps_mes + GPS_med_acc;
          interval::interval(&local_10a0,&local_1160,&local_1148);
          interval::operator=((interval *)&y_gps,&local_10a0);
          local_1160 = GPS_med_acc * -5.0 + z_gps_mes;
          local_1148 = GPS_med_acc * 5.0 + z_gps_mes;
          interval::interval(&local_10a0,&local_1160,&local_1148);
          interval::operator=((interval *)&z_gps,&local_10a0);
          if ((nmeadevice.bEnableGPRMC == 0) &&
             (nmeadevice.bEnableGPGLL != 0 || nmeadevice.bEnableGPGGA != 0)) {
            local_1118._32_8_ = 0;
            local_1118.tm_gmtoff = 0;
            local_1118.tm_mon = 0;
            local_1118.tm_year = 0;
            local_1118.tm_wday = 0;
            local_1118.tm_yday = 0;
            local_1118.tm_sec = 0;
            local_1118.tm_min = 0;
            local_1118.tm_hour = 0;
            local_1118.tm_mday = 0;
            local_1118.tm_zone = (char *)0x0;
            iVar11 = gettimeofday(&local_10b8,(__timezone_ptr_t)0x0);
            if (iVar11 != 0) {
              local_10b8.tv_sec = 0;
              local_10b8.tv_usec = 0;
            }
            tt = local_10b8.tv_sec;
            ptVar10 = gmtime(&tt);
            if (ptVar10 != (tm *)0x0) {
              local_1118.tm_year = ptVar10->tm_year;
              uVar2 = ptVar10->tm_mday;
              uVar3 = ptVar10->tm_mon;
              local_1118.tm_mday = uVar2;
              local_1118.tm_mon = uVar3;
            }
            local_1118.tm_hour = nmeadata.hour;
            local_1118.tm_min = nmeadata.minute;
            local_1118.tm_sec = 0;
            local_1118._32_8_ = local_1118._32_8_ & 0xffffffff00000000;
            tt = timegm(&local_1118);
            utc = (double)tt * 1000.0 + nmeadata.second * 1000.0;
          }
        }
        else {
          GNSSqualityNMEADevice[iVar13] = 0;
        }
        if ((nmeadevice.bEnableGPRMC != 0 && nmeadata.status == 'A') ||
           (nmeadevice.bEnableGPVTG != 0)) {
          sog = nmeadata.SOG;
          z_gps_mes = fmod_2PI((1.5707963267948966 - nmeadata.COG) - angle_env);
          interval::interval((interval *)&x_gps_mes,&z_gps_mes);
          local_1160 = -3.141592653589793;
          local_1148 = 3.141592653589793;
          interval::interval((interval *)&y_gps_mes,&local_1160,&local_1148);
          operator+((interval *)&x_gps_mes,(interval *)&y_gps_mes);
          interval::operator=((interval *)&cog_gps,&local_10a0);
        }
        if ((nmeadevice.bEnableGPRMC != 0) && (nmeadata.status == 'A')) {
          local_1118.tm_gmtoff = 0;
          local_1118.tm_zone = (char *)0x0;
          local_1118.tm_wday = 0;
          local_1118.tm_yday = 0;
          local_1118._32_8_ = 0;
          local_1118.tm_mon = nmeadata.month + -1;
          local_1118.tm_year = nmeadata.year + -0x76c;
          local_1118.tm_mday = nmeadata.day;
          local_1118.tm_hour = nmeadata.hour;
          local_1118.tm_min = nmeadata.minute;
          local_1118.tm_sec = 0;
          tt = timegm(&local_1118);
          utc = (double)tt * 1000.0 + nmeadata.second * 1000.0;
        }
        if ((nmeadevice.bEnableHCHDG != 0) && (robid == 0x8000)) {
          z_gps_mes = fmod_2PI((1.5707963267948966 - nmeadata.Heading) - angle_env);
          interval::interval((interval *)&x_gps_mes,&z_gps_mes);
          local_1160 = -psi_ahrs_acc;
          interval::interval((interval *)&y_gps_mes,&local_1160,&psi_ahrs_acc);
          operator+((interval *)&x_gps_mes,(interval *)&y_gps_mes);
          interval::operator=((interval *)&psi_ahrs,&local_10a0);
        }
        if (nmeadevice.bEnableWIMWV != 0 || nmeadevice.bEnableIIMWV != 0) {
          dVar15 = fmod_2PI(3.141592653589793 - nmeadata.ApparentWindDir);
          vawind = nmeadata.ApparentWindSpeed;
          psiawind = dVar15;
          if (bDisableRollWindCorrectionSailboat == 0) {
            dVar15 = sin(dVar15);
            dVar16 = Center((interval *)&phi_ahrs);
            local_1158 = cos(dVar16);
            dVar16 = cos(psiawind);
            dVar15 = atan2(dVar15,local_1158 * dVar16);
            dVar16 = Center((interval *)&psi_ahrs);
            psitwind = fmod_2PI(dVar16 + dVar15);
            dVar15 = vawind;
            if ((vawind <= 0.0) || (sog < GPS_SOG_for_valid_COG)) goto LAB_0014520b;
            local_1158 = sin(psitwind);
            local_10d8 = sog;
            dVar16 = Center((interval *)&cog_gps);
            dVar16 = sin(dVar16);
            dVar16 = dVar16 * local_10d8;
            dVar15 = dVar15 * local_1158;
            local_1158 = vawind;
            dVar17 = cos(psitwind);
            dVar15 = atan2(dVar16 + dVar15,local_1158 * dVar17);
            local_1158 = sog;
            dVar16 = Center((interval *)&cog_gps);
            dVar16 = cos(dVar16);
            dVar15 = dVar16 * local_1158 + dVar15;
          }
          else {
            dVar16 = Center((interval *)&psi_ahrs);
            dVar15 = dVar15 + dVar16;
          }
          psitwind = fmod_2PI(dVar15);
        }
LAB_0014520b:
        if (nmeadevice.bEnableWIMDA != 0 || nmeadevice.bEnableWIMWD != 0) {
          psitwind = fmod_2PI(((1.5707963267948966 - nmeadata.WindDir) + 3.141592653589793) -
                              angle_env);
          vtwind = nmeadata.WindSpeed;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_0014526f;
      }
      puts("Connection to a NMEADevice lost.");
      GNSSqualityNMEADevice[iVar13] = 0;
      DisconnectNMEADevice(&nmeadevice);
LAB_00144a6a:
      if (ExitOnErrorCount <= local_113c + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_00145346:
        bVar5 = true;
        goto LAB_00145348;
      }
      bVar4 = false;
      bVar5 = true;
      local_113c = local_113c + 1;
    }
    else {
      if (!bVar4) {
        puts("Restarting a NMEADevice.");
        GNSSqualityNMEADevice[iVar13] = 0;
        DisconnectNMEADevice(&nmeadevice);
      }
      bRestartNMEADevice[iVar13] = 0;
LAB_00144a40:
      iVar7 = ConnectNMEADevice(&nmeadevice,szCfgFilePath);
      iVar11 = nmeadevice.threadperiod;
      if (iVar7 != 0) {
        GNSSqualityNMEADevice[iVar13] = 0;
        mSleep(1000);
        goto LAB_00144a6a;
      }
      memset(&nmeadata,0,0x3d8);
      if (nmeadevice.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)nmeadevice.pfSaveFile);
        nmeadevice.pfSaveFile = (FILE *)0x0;
      }
      iVar14 = iVar11;
      if (nmeadevice.bSaveRawData == 0) {
LAB_0014526f:
        bVar5 = false;
        bVar4 = true;
      }
      else {
        if (nmeadevice.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"nmeadevice",0xb);
        }
        else {
          sprintf(szTemp,"%.127s",nmeadevice.szCfgFilePath);
        }
        sVar8 = strlen(szTemp);
        iVar11 = (int)sVar8 + 1;
        uVar12 = sVar8 & 0xffffffff;
        do {
          if ((int)uVar12 < 1) goto LAB_00144bab;
          uVar1 = uVar12 - 1;
          iVar11 = iVar11 + -1;
          lVar6 = uVar12 - 1;
          uVar12 = uVar1;
        } while (szTemp[lVar6] != '.');
        if ((uVar1 != 0) && (iVar11 <= (int)sVar8)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar8 - (uVar1 & 0xffffffff));
        }
LAB_00144bab:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar9 = strtimeex_fns();
        bVar5 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar9);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        nmeadevice.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
        bVar4 = true;
        if ((FILE *)nmeadevice.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create NMEADevice data file.");
          bVar5 = false;
          goto LAB_00145348;
        }
      }
    }
    if (bExit != 0) {
LAB_00145348:
      StopChronoQuick(&chrono_period);
      GNSSqualityNMEADevice[iVar13] = 0;
      if (nmeadevice.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)nmeadevice.pfSaveFile);
        nmeadevice.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar5) {
        DisconnectNMEADevice(&nmeadevice);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE nmeadevice;
	NMEADATA nmeadata;
	struct tm t;
	time_t tt = 0;
	struct timeval tv;
	struct tm* timeptr = NULL;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "NMEADevice%d.txt", deviceid);

	memset(&nmeadevice, 0, sizeof(NMEADEVICE));

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("NMEADevice paused.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a NMEADevice.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			bRestartNMEADevice[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNMEADevice(&nmeadevice, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nmeadevice.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nmeadevice.pfSaveFile != NULL)
				{
					fclose(nmeadevice.pfSaveFile); 
					nmeadevice.pfSaveFile = NULL;
				}
				if ((nmeadevice.bSaveRawData)&&(nmeadevice.pfSaveFile == NULL)) 
				{
					if (strlen(nmeadevice.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nmeadevice.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nmeadevice");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nmeadevice.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nmeadevice.pfSaveFile == NULL) 
					{
						printf("Unable to create NMEADevice data file.\n");
						break;
					}
				}
			}
			else 
			{
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataNMEADevice(&nmeadevice, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				//printf("GPS_quality_indicator : %d, status : %c\n", nmeadata.GPS_quality_indicator, nmeadata.status);

				if ((nmeadata.GPS_quality_indicator > 0)||(nmeadata.status == 'A'))
				{
					GNSSqualityNMEADevice[deviceid] = AUTONOMOUS_GNSS_FIX;

					// Old...

					double x_gps_mes = 0, y_gps_mes = 0, z_gps_mes = 0;
					GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, nmeadata.Latitude, nmeadata.Longitude, nmeadata.Altitude, &x_gps_mes, &y_gps_mes, &z_gps_mes);
					// Default accuracy...
					x_gps = interval(x_gps_mes-GPS_med_acc, x_gps_mes+GPS_med_acc);
					y_gps = interval(y_gps_mes-GPS_med_acc, y_gps_mes+GPS_med_acc);
					z_gps = interval(z_gps_mes-5*GPS_med_acc, z_gps_mes+5*GPS_med_acc);

					if ((!nmeadevice.bEnableGPRMC)&&(nmeadevice.bEnableGPGGA||nmeadevice.bEnableGPGLL))
					{
						// Try to extrapolate UTC as ms from the computer date since not all the time and date data are available in GGA or GLL...
						memset(&t, 0, sizeof(t));
						if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
						tt = tv.tv_sec;
						timeptr = gmtime(&tt);
						if (timeptr != NULL)
						{
							t.tm_year = timeptr->tm_year; t.tm_mon = timeptr->tm_mon; t.tm_mday = timeptr->tm_mday;
						}
						t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
						tt = timegm(&t);
						utc = tt*1000.0+nmeadata.second*1000.0;
					}
				}
				else
				{
					GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				}

				// Should check better if valid...
				if ((nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))||nmeadevice.bEnableGPVTG)
				{
					sog = nmeadata.SOG;
					cog_gps = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
				}

				if (nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))
				{
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = nmeadata.year-1900; t.tm_mon = nmeadata.month-1; t.tm_mday = nmeadata.day; 
					t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+nmeadata.second*1000.0;
				}

				if (nmeadevice.bEnableHCHDG)
				{
					if (robid == SAILBOAT2_ROBID) psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				}

				if (nmeadevice.bEnableIIMWV||nmeadevice.bEnableWIMWV)
				{
					// Apparent wind (in robot coordinate system).
					psiawind = fmod_2PI(-nmeadata.ApparentWindDir+M_PI); 
					vawind = nmeadata.ApparentWindSpeed;
					// True wind must be computed from apparent wind.
					if (bDisableRollWindCorrectionSailboat)
						psitwind = fmod_2PI(psiawind+Center(psi_ahrs)); // Robot speed and roll not taken into account...
					else
					{
						psitwind = fmod_2PI(atan2(sin(psiawind),cos(Center(phi_ahrs))*cos(psiawind))+Center(psi_ahrs)); // Robot speed not taken into account, but with roll correction...
						if ((vawind > 0)&&(sog >= GPS_SOG_for_valid_COG))
						{
							psitwind = fmod_2PI(atan2(vawind*sin(psitwind)+sog*sin(Center(cog_gps)),vawind*cos(psitwind))+sog*cos(Center(cog_gps))); // With speed correction...
						}
					}
				}

				if (nmeadevice.bEnableWIMWD||nmeadevice.bEnableWIMDA)
				{
					// True wind.
					psitwind = fmod_2PI(M_PI/2.0-nmeadata.WindDir+M_PI-angle_env);
					vtwind = nmeadata.WindSpeed;
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NMEADevice lost.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}		
		}

		//printf("NMEADeviceThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	if (nmeadevice.pfSaveFile != NULL)
	{
		fclose(nmeadevice.pfSaveFile); 
		nmeadevice.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNMEADevice(&nmeadevice);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}